

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O1

void __thiscall
cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense>::BinaryQuadraticModel
          (BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense> *this,
          BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense> *param_1)

{
  size_t sVar1;
  undefined4 uVar2;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_unsigned_long>,_false>_>_>
  local_20;
  
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_1> *)this,
             (DenseStorage<double,__1,__1,__1,_1> *)param_1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->_idx_to_label,&param_1->_idx_to_label);
  local_20._M_h = (__hashtable_alloc *)&this->_label_to_idx;
  (this->_label_to_idx)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->_label_to_idx)._M_h._M_bucket_count = (param_1->_label_to_idx)._M_h._M_bucket_count;
  (this->_label_to_idx)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_label_to_idx)._M_h._M_element_count = (param_1->_label_to_idx)._M_h._M_element_count;
  uVar2 = *(undefined4 *)&(param_1->_label_to_idx)._M_h._M_rehash_policy.field_0x4;
  sVar1 = (param_1->_label_to_idx)._M_h._M_rehash_policy._M_next_resize;
  (this->_label_to_idx)._M_h._M_rehash_policy._M_max_load_factor =
       (param_1->_label_to_idx)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->_label_to_idx)._M_h._M_rehash_policy.field_0x4 = uVar2;
  (this->_label_to_idx)._M_h._M_rehash_policy._M_next_resize = sVar1;
  (this->_label_to_idx)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_long>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_long>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,unsigned_long>,false>>>>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_long>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)local_20._M_h,&(param_1->_label_to_idx)._M_h,&local_20);
  this->m_vartype = param_1->m_vartype;
  this->m_offset = param_1->m_offset;
  return;
}

Assistant:

BinaryQuadraticModel( const BinaryQuadraticModel & ) = default;